

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

string * __thiscall
deqp::gls::ShaderExecUtil::generateEmptyFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderExecUtil *this,GLSLVersion version)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ostringstream src;
  ostringstream local_190 [376];
  
  bVar1 = glu::glslVersionUsesInOutQualifiers((GLSLVersion)this);
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar2 = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  poVar3 = std::operator<<((ostream *)local_190,pcVar2);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  if (!bVar1) {
    std::operator<<((ostream *)local_190,"\tgl_FragColor = vec4(0.0);\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateEmptyFragmentSource (glu::GLSLVersion version)
{
	const bool			customOut		= glu::glslVersionUsesInOutQualifiers(version);
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(version) << "\n";

	// \todo [2013-08-05 pyry] Do we need one dummy output?

	src << "void main (void)\n{\n";
	if (!customOut)
		src << "	gl_FragColor = vec4(0.0);\n";
	src << "}\n";

	return src.str();
}